

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O0

void prepare_2_cb(uv_prepare_t *handle)

{
  int iVar1;
  int r;
  uv_prepare_t *handle_local;
  
  fprintf(_stderr,"%s","PREPARE_2_CB\n");
  fflush(_stderr);
  if (handle != &prepare_2_handle) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-handles.c"
            ,0xf7,"handle == &prepare_2_handle");
    abort();
  }
  if (loop_iteration % 2 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-handles.c"
            ,0xfd,"loop_iteration % 2 != 0");
    abort();
  }
  iVar1 = uv_prepare_stop(&prepare_2_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-handles.c"
            ,0x100,"r == 0");
    abort();
  }
  prepare_2_cb_called = prepare_2_cb_called + 1;
  return;
}

Assistant:

static void prepare_2_cb(uv_prepare_t* handle) {
  int r;

  fprintf(stderr, "%s", "PREPARE_2_CB\n");
  fflush(stderr);
  ASSERT(handle == &prepare_2_handle);

  /* Prepare_2 gets started by prepare_1 when (loop_iteration % 2 == 0), and it
   * stops itself immediately. A started watcher is not queued until the next
   * round, so when this callback is made (loop_iteration % 2 == 0) cannot be
   * true. */
  ASSERT(loop_iteration % 2 != 0);

  r = uv_prepare_stop((uv_prepare_t*)handle);
  ASSERT(r == 0);

  prepare_2_cb_called++;
}